

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

ssize_t __thiscall
zmq::detail::socket_base::send(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 in_register_00000034;
  int nbytes;
  int in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  uVar4 = SUB84(__buf,0);
  message_t::handle((message_t *)CONCAT44(in_register_00000034,__fd));
  iVar1 = zmq_msg_send((zmq_msg_t *)this,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  uVar3 = CONCAT44(extraout_var,iVar1);
  if (iVar1 < 0) {
    iVar2 = zmq_errno();
    uVar3 = CONCAT44(extraout_var_00,iVar2);
    if (iVar2 != 0xb) {
      uVar3 = __cxa_allocate_exception(0x10);
      error_t::error_t((error_t *)CONCAT44(uVar4,iVar1));
      __cxa_throw(uVar3,&error_t::typeinfo,error_t::~error_t);
    }
    local_1 = 0;
  }
  else {
    local_1 = 1;
  }
  return CONCAT71((int7)((ulong)uVar3 >> 8),local_1);
}

Assistant:

bool send(message_t &msg_,
              int flags_ = 0) // default until removed
    {
        int nbytes = zmq_msg_send(msg_.handle(), _handle, flags_);
        if (nbytes >= 0)
            return true;
        if (zmq_errno() == EAGAIN)
            return false;
        throw error_t();
    }